

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void __thiscall
ThreadParser::SAXHandler::startElement(SAXHandler *this,XMLCh *name,AttributeList *attributes)

{
  XMLCh *pXVar1;
  XMLCh *pXVar2;
  XMLCh *attVal;
  XMLCh *attNam;
  XMLSize_t i;
  XMLSize_t n;
  AttributeList *attributes_local;
  XMLCh *name_local;
  SAXHandler *this_local;
  
  addToCheckSum(this->SAXInstance,name,0xffffffffffffffff);
  pXVar1 = (XMLCh *)(**(code **)(*(long *)attributes + 0x10))();
  for (attNam = (XMLCh *)0x0; attNam < pXVar1; attNam = (XMLCh *)((long)attNam + 1)) {
    pXVar2 = (XMLCh *)(**(code **)(*(long *)attributes + 0x18))(attributes,attNam);
    addToCheckSum(this->SAXInstance,pXVar2,0xffffffffffffffff);
    pXVar2 = (XMLCh *)(**(code **)(*(long *)attributes + 0x28))(attributes,attNam);
    addToCheckSum(this->SAXInstance,pXVar2,0xffffffffffffffff);
  }
  return;
}

Assistant:

void ThreadParser::SAXHandler::startElement(const XMLCh *const name, AttributeList &attributes)
{
    SAXInstance->addToCheckSum(name);
    XMLSize_t n = attributes.getLength();
    XMLSize_t i;
    for (i=0; i<n; i++)
    {
        const XMLCh *attNam = attributes.getName(i);
        SAXInstance->addToCheckSum(attNam);
        const XMLCh *attVal = attributes.getValue(i);
        SAXInstance->addToCheckSum(attVal);
    }
}